

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fibonacci.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__nptr;
  char cVar1;
  int iVar2;
  int iVar3;
  istream *piVar4;
  int *piVar5;
  long lVar6;
  long *plVar7;
  undefined8 uVar8;
  int num;
  string line;
  ifstream stream;
  int local_264;
  char *local_260;
  char *local_258;
  undefined8 local_250;
  char local_248 [16];
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,argv[1],_S_in);
  local_258 = local_248;
  local_250 = 0;
  local_248[0] = '\0';
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_258,cVar1);
    __nptr = local_258;
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      if (local_258 != local_248) {
        operator_delete(local_258);
      }
      std::ifstream::~ifstream(local_238);
      return 0;
    }
    piVar5 = __errno_location();
    iVar3 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol(__nptr,&local_260,10);
    if (local_260 == __nptr) break;
    iVar2 = (int)lVar6;
    if ((iVar2 != lVar6) || (*piVar5 == 0x22)) goto LAB_001013a9;
    if (*piVar5 == 0) {
      *piVar5 = iVar3;
    }
    local_264 = iVar2;
    if (-1 < iVar2) {
      iVar3 = genFibonacci(&local_264);
      plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_001013a9:
  uVar8 = std::__throw_out_of_range("stoi");
  if (*piVar5 == 0) {
    *piVar5 = iVar3;
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  std::ifstream::~ifstream(local_238);
  _Unwind_Resume(uVar8);
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
//    ifstream stream("/home/arkezar/fib");
    string line;
    int num;
    while (getline(stream, line)) {
        num = stoi(line);
        if(num >= 0){

            cout << genFibonacci(num) << endl;
        }
    }
    return 0;
}